

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

TestLog * glu::operator<<(TestLog *log,ShaderProgramInfo *shaderProgramInfo)

{
  pointer programInfo;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference ppSVar4;
  ShaderInfo **local_90;
  ulong local_50;
  size_t ndx;
  allocator<const_glu::ShaderInfo_*> local_31;
  undefined1 local_30 [8];
  vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> shaderPtrs;
  ShaderProgramInfo *shaderProgramInfo_local;
  TestLog *log_local;
  
  shaderPtrs.super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)shaderProgramInfo;
  sVar2 = std::vector<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>::size
                    (&shaderProgramInfo->shaders);
  std::allocator<const_glu::ShaderInfo_*>::allocator(&local_31);
  std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::vector
            ((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> *)local_30,
             sVar2,&local_31);
  std::allocator<const_glu::ShaderInfo_*>::~allocator(&local_31);
  local_50 = 0;
  while( true ) {
    sVar2 = std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::size
                      ((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> *)
                       local_30);
    programInfo = shaderPtrs.
                  super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (sVar2 <= local_50) break;
    pvVar3 = std::vector<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>::operator[]
                       ((vector<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_> *)
                        (shaderPtrs.
                         super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),local_50);
    ppSVar4 = std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::
              operator[]((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                          *)local_30,local_50);
    *ppSVar4 = pvVar3;
    local_50 = local_50 + 1;
  }
  sVar2 = std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::size
                    ((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> *)
                     local_30);
  bVar1 = std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::empty
                    ((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> *)
                     local_30);
  if (bVar1) {
    local_90 = (ShaderInfo **)0x0;
  }
  else {
    local_90 = std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::
               operator[]((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                           *)local_30,0);
  }
  logShaderProgram(log,(ProgramInfo *)programInfo,sVar2,local_90);
  std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::~vector
            ((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> *)local_30);
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const ShaderProgramInfo& shaderProgramInfo)
{
	std::vector<const ShaderInfo*>	shaderPtrs	(shaderProgramInfo.shaders.size());

	for (size_t ndx = 0; ndx < shaderPtrs.size(); ndx++)
		shaderPtrs[ndx] = &shaderProgramInfo.shaders[ndx];

	logShaderProgram(log, shaderProgramInfo.program, shaderPtrs.size(), shaderPtrs.empty() ? DE_NULL : &shaderPtrs[0]);

	return log;
}